

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restraint.hpp
# Opt level: O2

void __thiscall OpenMD::Restraint::Restraint(Restraint *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Restraint = (_func_int **)&PTR__Restraint_002bbc18;
  this->restType_ = 0;
  this->twist0_ = 0.0;
  this->swingX0_ = 0.0;
  this->swingY0_ = 0.0;
  this->posZ0_ = 0.0;
  this->printRest_ = false;
  (this->restName_)._M_dataplus._M_p = (pointer)&(this->restName_).field_2;
  (this->restName_)._M_string_length = 0;
  (this->restName_).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->restInfo_)._M_t._M_impl.super__Rb_tree_header;
  (this->restInfo_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->restInfo_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->restInfo_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->restInfo_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->restInfo_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Restraint() :
        twist0_(0.0), swingX0_(0.0), swingY0_(0.0), posZ0_(0.0),
        printRest_(false), restType_(0) {}